

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetCFBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_101;
  string local_100;
  cmValue local_e0;
  cmValue p;
  string ext;
  string local_78;
  cmAlphaNum local_58;
  byte local_25;
  BundleDirectoryLevel local_24;
  string *psStack_20;
  BundleDirectoryLevel level_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_25 = 0;
  local_24 = level;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetOutputName(&local_78,this,config,RuntimeBinaryArtifact);
  cmAlphaNum::cmAlphaNum(&local_58,&local_78);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&ext.field_2 + 8),'.');
  cmStrCat<>(__return_storage_ptr__,&local_58,(cmAlphaNum *)((long)&ext.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&p);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"BUNDLE_EXTENSION",&local_101);
  local_e0 = GetProperty(this,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  bVar1 = cmValue::operator_cast_to_bool(&local_e0);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_e0);
    std::__cxx11::string::operator=((string *)&p,(string *)psVar2);
  }
  else {
    bVar1 = IsXCTestOnApple(this);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&p,"xctest");
    }
    else {
      std::__cxx11::string::operator=((string *)&p,"bundle");
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&p);
  bVar1 = anon_unknown.dwarf_dce8de::shouldAddContentLevel(local_24);
  if ((bVar1) && (bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile), !bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/Contents");
    bVar1 = anon_unknown.dwarf_dce8de::shouldAddFullLevel(local_24);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/MacOS");
    }
  }
  local_25 = 1;
  std::__cxx11::string::~string((string *)&p);
  if ((local_25 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCFBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath = cmStrCat(
    this->GetOutputName(config, cmStateEnums::RuntimeBinaryArtifact), '.');
  std::string ext;
  if (cmValue p = this->GetProperty("BUNDLE_EXTENSION")) {
    ext = *p;
  } else {
    if (this->IsXCTestOnApple()) {
      ext = "xctest";
    } else {
      ext = "bundle";
    }
  }
  fpath += ext;
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}